

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,OpenMode modes)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  bool bVar1;
  iterator this;
  iterator this_00;
  undefined4 in_EDX;
  iterator in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QStringList modeList;
  undefined4 in_stack_fffffffffffffe08;
  OpenModeFlag in_stack_fffffffffffffe0c;
  char t;
  QList<QString> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  iterator __first;
  QChar sep;
  QDebug *in_stack_fffffffffffffe38;
  qsizetype in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe68;
  QChar local_122 [27];
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_ec;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_cc;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_ac;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_8c;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_6c;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_4c;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first.i = (QString *)in_RDI;
  local_c = in_EDX;
  QDebug::operator<<(in_stack_fffffffffffffe38,in_stack_fffffffffffffe68);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2c7283);
  local_2c = local_c;
  bVar1 = operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                     SUB84((ulong)in_stack_fffffffffffffe18 >> 0x20,0),
                     (OpenModeFlag)in_stack_fffffffffffffe10);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
    QVar2.m_data = in_stack_fffffffffffffe48;
    QVar2.m_size = in_stack_fffffffffffffe40;
    QString::QString(in_RSI.i,QVar2);
    QList<QString>::operator<<
              (in_stack_fffffffffffffe10,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    t = (char)(in_stack_fffffffffffffe0c >> 0x18);
    QString::~QString((QString *)0x2c730c);
  }
  else {
    local_4c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1.m_data = in_stack_fffffffffffffe48;
      latin1.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c73eb);
    }
    local_6c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_6c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1_00.m_data = in_stack_fffffffffffffe48;
      latin1_00.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1_00);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c74aa);
    }
    local_8c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_8c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1_01.m_data = in_stack_fffffffffffffe48;
      latin1_01.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1_01);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c755d);
    }
    local_ac.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_ac);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1_02.m_data = in_stack_fffffffffffffe48;
      latin1_02.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1_02);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c7610);
    }
    local_cc.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_cc);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1_03.m_data = in_stack_fffffffffffffe48;
      latin1_03.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1_03);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c76c3);
    }
    local_ec.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe0c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_ec);
    if (bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      latin1_04.m_data = (char *)QVar2.m_size;
      latin1_04.m_size = in_stack_fffffffffffffe40;
      QString::QString(in_RSI.i,latin1_04);
      QList<QString>::operator<<
                (in_stack_fffffffffffffe10,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QString::~QString((QString *)0x2c7776);
    }
    t = (char)(in_stack_fffffffffffffe0c >> 0x18);
  }
  this = QList<QString>::begin(in_stack_fffffffffffffe10);
  this_00 = QList<QString>::end(in_stack_fffffffffffffe10);
  std::sort<QList<QString>::iterator>(__first,in_RSI);
  sep.ucs = (char16_t)((ulong)__first.i >> 0x30);
  QChar::QChar<char16_t,_true>(local_122,L'|');
  QListSpecialMethods<QString>::join((QListSpecialMethods<QString> *)this.i,sep);
  QDebug::operator<<((QDebug *)in_RSI.i,this.i);
  QString::~QString((QString *)0x2c7843);
  QDebug::operator<<((QDebug *)this_00.i,t);
  QDebug::QDebug((QDebug *)in_RSI.i,(QDebug *)this.i);
  QList<QString>::~QList((QList<QString> *)0x2c7870);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, QIODevice::OpenMode modes)
{
    debug << "OpenMode(";
    QStringList modeList;
    if (modes == QIODevice::NotOpen) {
        modeList << "NotOpen"_L1;
    } else {
        if (modes & QIODevice::ReadOnly)
            modeList << "ReadOnly"_L1;
        if (modes & QIODevice::WriteOnly)
            modeList << "WriteOnly"_L1;
        if (modes & QIODevice::Append)
            modeList << "Append"_L1;
        if (modes & QIODevice::Truncate)
            modeList << "Truncate"_L1;
        if (modes & QIODevice::Text)
            modeList << "Text"_L1;
        if (modes & QIODevice::Unbuffered)
            modeList << "Unbuffered"_L1;
    }
    std::sort(modeList.begin(), modeList.end());
    debug << modeList.join(u'|');
    debug << ')';
    return debug;
}